

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O2

int sLUWorkInit(int m,int n,int panel_size,int **iworkptr,float **dworkptr,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  float *pfVar5;
  float *pfVar6;
  int bytes;
  
  iVar2 = sp_ienv(3);
  iVar3 = sp_ienv(7);
  iVar2 = sp_ienv((uint)(iVar2 <= iVar3) * 4 + 3);
  iVar3 = sp_ienv(4);
  bytes = (panel_size * 2 + 5) * m * 4;
  iVar2 = (iVar3 + iVar2) * panel_size;
  if (iVar2 <= m) {
    iVar2 = m;
  }
  if (Glu->MemModel == SYSTEM) {
    piVar4 = int32Calloc(bytes >> 2);
  }
  else {
    piVar4 = (int *)suser_malloc(bytes,1,Glu);
  }
  *iworkptr = piVar4;
  if (piVar4 == (int *)0x0) {
    fwrite("sLUWorkInit: malloc fails for local iworkptr[]\n",0x2f,1,_stderr);
    iVar2 = bytes + n;
  }
  else {
    iVar3 = (iVar2 + panel_size * m) * 4;
    if (Glu->MemModel == SYSTEM) {
      pfVar5 = (float *)superlu_malloc((long)iVar3);
      *dworkptr = pfVar5;
    }
    else {
      pfVar5 = (float *)suser_malloc(iVar3,1,Glu);
      *dworkptr = pfVar5;
      if (((ulong)pfVar5 & 7) != 0) {
        pfVar6 = (float *)(((long)pfVar5 + 7U & 0xfffffffffffffff8) - 8);
        *dworkptr = pfVar6;
        iVar2 = (int)pfVar5 - (int)pfVar6;
        piVar1 = &(Glu->stack).top2;
        *piVar1 = *piVar1 - iVar2;
        piVar1 = &(Glu->stack).used;
        *piVar1 = *piVar1 + iVar2;
        return 0;
      }
    }
    iVar2 = 0;
    if (pfVar5 == (float *)0x0) {
      fwrite("malloc fails for local dworkptr[].",0x22,1,_stderr);
      iVar2 = bytes + n + iVar3;
    }
  }
  return iVar2;
}

Assistant:

int
sLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            float **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    float *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(float);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) suser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "sLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (float *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (float *) suser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (float*) DoubleAlign(*dworkptr);
	    *dworkptr = (float*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("sLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}